

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map_checked.hh
# Opt level: O0

void __thiscall doublechecked::Roaring64Map::Roaring64Map(Roaring64Map *this,Roaring64Map *r)

{
  Roaring64Map *in_RDI;
  Roaring64Map *r_00;
  Roaring64Map *in_stack_ffffffffffffffd0;
  Roaring64Map *this_00;
  
  r_00 = in_RDI;
  roaring::Roaring64Map::Roaring64Map(in_stack_ffffffffffffffd0);
  this_00 = in_RDI + 1;
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             0x114a07);
  roaring::Roaring64Map::operator=(this_00,r_00);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::operator=
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)this_00
             ,(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)r_00);
  return;
}

Assistant:

Roaring64Map(const Roaring64Map &r) {
        plain = r.plain;
        check = r.check;
    }